

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O0

void __thiscall
upb_test::DefToProto_TestEditionsLegacyFeatures_Test::DefToProto_TestEditionsLegacyFeatures_Test
          (DefToProto_TestEditionsLegacyFeatures_Test *this)

{
  DefToProto_TestEditionsLegacyFeatures_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__DefToProto_TestEditionsLegacyFeatures_Test_00a14ef0;
  return;
}

Assistant:

TEST(DefToProto, TestEditionsLegacyFeatures) {
  upb::Arena arena;
  upb::DefPool defpool;
  upb_StringView test_file_desc =
      upb_util_def_to_proto_editions_test_proto_upbdefinit
          .descriptor;
  const auto* file = google_protobuf_FileDescriptorProto_parse(
      test_file_desc.data, test_file_desc.size, arena.ptr());

  size_t size;
  const auto* messages = google_protobuf_FileDescriptorProto_message_type(file, &size);
  ASSERT_EQ(size, 1);
  const auto* fields = google_protobuf_DescriptorProto_field(messages[0], &size);
  ASSERT_EQ(size, 2);
  EXPECT_EQ(google_protobuf_FieldDescriptorProto_label(fields[0]),
            google_protobuf_FieldDescriptorProto_LABEL_OPTIONAL);
  EXPECT_EQ(google_protobuf_FieldDescriptorProto_type(fields[1]),
            google_protobuf_FieldDescriptorProto_TYPE_MESSAGE);
}